

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O1

Point3fi * __thiscall
pbrt::Point3fi::operator-
          (Point3fi *__return_storage_ptr__,Point3fi *this,Vector3<pbrt::Interval> *v)

{
  Interval IVar1;
  undefined8 uVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  IVar1 = (v->super_Tuple3<pbrt::Vector3,_pbrt::Interval>).x;
  auVar10._8_8_ = 0;
  auVar10._0_4_ = IVar1.low;
  auVar10._4_4_ = IVar1.high;
  auVar10 = vmovshdup_avx(auVar10);
  fVar4 = (this->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low -
          auVar10._0_4_;
  if (-INFINITY < fVar4) {
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar4),ZEXT816(0) << 0x40,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar4 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar4);
    fVar4 = (float)((int)fVar4 + -1 + (uint)(fVar4 <= 0.0) * 2);
  }
  fVar8 = (this->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high -
          IVar1.low;
  if (fVar8 < INFINITY) {
    auVar12._0_12_ = ZEXT812(0);
    auVar12._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar8),auVar12,0);
    fVar8 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar8);
    fVar8 = (float)((-(uint)(fVar8 < 0.0) | 1) + (int)fVar8);
  }
  IVar1 = (v->super_Tuple3<pbrt::Vector3,_pbrt::Interval>).y;
  auVar13._8_8_ = 0;
  auVar13._0_4_ = IVar1.low;
  auVar13._4_4_ = IVar1.high;
  auVar10 = vmovshdup_avx(auVar13);
  fVar5 = (this->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low -
          auVar10._0_4_;
  if (-INFINITY < fVar5) {
    auVar14._0_12_ = ZEXT812(0);
    auVar14._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar5),auVar14,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar5 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar5);
    fVar5 = (float)((int)fVar5 + -1 + (uint)(fVar5 <= 0.0) * 2);
  }
  fVar9 = (this->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high -
          IVar1.low;
  if (fVar9 < INFINITY) {
    auVar15._0_12_ = ZEXT812(0);
    auVar15._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar9),auVar15,0);
    fVar9 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar9);
    fVar9 = (float)((-(uint)(fVar9 < 0.0) | 1) + (int)fVar9);
  }
  IVar1 = (v->super_Tuple3<pbrt::Vector3,_pbrt::Interval>).z;
  auVar16._8_8_ = 0;
  auVar16._0_4_ = IVar1.low;
  auVar16._4_4_ = IVar1.high;
  auVar10 = vmovshdup_avx(auVar16);
  fVar6 = (this->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low -
          auVar10._0_4_;
  if (-INFINITY < fVar6) {
    auVar11._0_12_ = ZEXT812(0);
    auVar11._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar6),auVar11,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar6 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar6);
    fVar6 = (float)((int)fVar6 + -1 + (uint)(fVar6 <= 0.0) * 2);
  }
  fVar7 = (this->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high -
          IVar1.low;
  if (fVar7 < INFINITY) {
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar7),ZEXT816(0) << 0x20,0);
    fVar7 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar7);
    fVar7 = (float)((-(uint)(fVar7 < 0.0) | 1) + (int)fVar7);
  }
  auVar12 = vminss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar5));
  auVar10 = vmaxss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar5));
  auVar10 = vinsertps_avx(auVar12,auVar10,0x10);
  auVar13 = vminss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar4));
  auVar12 = vmaxss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar4));
  auVar12 = vinsertps_avx(auVar13,auVar12,0x10);
  auVar13 = vmovlhps_avx(auVar12,auVar10);
  auVar12 = vminss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar6));
  auVar10 = vmaxss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar6));
  auVar10 = vinsertps_avx(auVar12,auVar10,0x10);
  (__return_storage_ptr__->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.
  x.low = (Float)(int)auVar13._0_8_;
  (__return_storage_ptr__->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.
  x.high = (Float)(int)((ulong)auVar13._0_8_ >> 0x20);
  (__return_storage_ptr__->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.
  y.low = (Float)(int)auVar13._8_8_;
  (__return_storage_ptr__->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.
  y.high = (Float)(int)((ulong)auVar13._8_8_ >> 0x20);
  IVar1 = (Interval)vmovlps_avx(auVar10);
  (__return_storage_ptr__->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.
  z = IVar1;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU Point3fi operator-(const Vector3<U> &v) const {
        DCHECK(!v.HasNaN());
        return {x - v.x, y - v.y, z - v.z};
    }